

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::SparseMatrix
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t rows,size_t cols,
          VectorDynSize *memoryReserveDescription)

{
  VectorDynSize *in_RCX;
  _func_int **in_RDX;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_RSI;
  VectorDynSize *in_RDI;
  VectorDynSize *vectorSize;
  size_t *vector;
  
  VectorDynSize::VectorDynSize(in_RDI);
  vectorSize = in_RDI + 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x774932);
  vector = &in_RDI[1].m_capacity;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x774945);
  in_RDI[2].m_size = 0;
  in_RDI[2].m_capacity = (size_t)in_RSI;
  in_RDI[3]._vptr_VectorDynSize = in_RDX;
  VectorDynSize::data(in_RCX);
  VectorDynSize::size(in_RCX);
  initializeMatrix(in_RSI,(size_t)in_RDI,(double *)vector,(size_t)vectorSize);
  return;
}

Assistant:

SparseMatrix<iDynTree::RowMajor>::SparseMatrix(std::size_t rows, std::size_t cols, const iDynTree::VectorDynSize& memoryReserveDescription)
    : m_allocatedSize(0)
    , m_rows(rows)
    , m_columns(cols)
    {
        initializeMatrix(rows, memoryReserveDescription.data(), memoryReserveDescription.size());
    }